

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<long_*> *fmt)

{
  long *plVar1;
  
  std::operator<<(str,"{ ");
  for (plVar1 = fmt->begin; plVar1 != fmt->end; plVar1 = plVar1 + 1) {
    if (plVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::ostream::_M_insert<long>((long)str);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}